

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

bool __thiscall
llvm::cl::parser<unsigned_long_long>::parse
          (parser<unsigned_long_long> *this,Option *O,StringRef ArgName,StringRef Arg,
          unsigned_long_long *Value)

{
  Child LHS;
  Child CVar1;
  bool bVar2;
  raw_ostream *Errs;
  Child RHS;
  StringRef Str;
  Child local_78 [2];
  undefined8 local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  NodeKind local_50;
  char cStack_4f;
  undefined6 uStack_4e;
  undefined4 local_48;
  undefined4 uStack_44;
  NodeKind local_38;
  char cStack_37;
  undefined6 uStack_36;
  StringRef local_30;
  
  local_30.Length = Arg.Length;
  local_30.Data = Arg.Data;
  Str.Length = 0;
  Str.Data = (char *)local_30.Length;
  bVar2 = getAsUnsignedInteger
                    ((llvm *)local_30.Data,Str,(uint)local_78,(unsigned_long_long *)local_30.Data);
  if (bVar2) {
    Twine::Twine((Twine *)&local_48,"\'",&local_30);
    Twine::Twine((Twine *)&local_60,"\' value invalid for uint argument!");
    if ((local_38 == NullKind) || (local_50 == NullKind)) {
      local_68 = CONCAT62(local_68._2_6_,0x100);
    }
    else if (local_38 == EmptyKind) {
      local_68 = CONCAT62(uStack_4e,CONCAT11(cStack_4f,local_50));
    }
    else if (local_50 == EmptyKind) {
      local_68 = CONCAT62(uStack_36,CONCAT11(cStack_37,local_38));
    }
    else {
      LHS._4_4_ = uStack_44;
      LHS.decUI = local_48;
      if (cStack_37 != '\x01') {
        local_38 = TwineKind;
        LHS.twine = (Twine *)&local_48;
      }
      if (cStack_4f != '\x01') {
        local_50 = TwineKind;
      }
      CVar1._4_4_ = uStack_5c;
      CVar1.decUI = local_60;
      RHS.twine = (Twine *)&local_60;
      if (cStack_4f == '\x01') {
        RHS = CVar1;
      }
      Twine::Twine((Twine *)local_78,LHS,local_38,RHS,local_50);
    }
    Errs = errs();
    Option::error(O,(Twine *)local_78,(StringRef)ZEXT816(0),Errs);
  }
  else {
    *Value = CONCAT44(local_78[0]._4_4_,local_78[0].decUI);
  }
  return bVar2;
}

Assistant:

bool parser<unsigned long long>::parse(Option &O, StringRef ArgName,
                                       StringRef Arg,
                                       unsigned long long &Value) {

  if (Arg.getAsInteger(0, Value))
    return O.error("'" + Arg + "' value invalid for uint argument!");
  return false;
}